

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int32 iVar2;
  cmd_ln_t *pcVar3;
  long lVar4;
  double dVar5;
  uint32 *in_stack_fffffffffffffea8;
  uint local_fc;
  uint local_f8;
  uint32 s;
  uint32 i;
  uint32 gau_begin;
  model_def_t *mdef;
  int32 *cb2mllr;
  float32 ***B;
  float32 ****A;
  uint32 *veclen_rd;
  uint32 *veclen;
  uint32 n_density_rd;
  uint32 n_stream_rd;
  uint32 n_mgau_rd;
  uint32 n_mllr_class;
  uint32 n_density;
  uint32 n_stream;
  uint32 n_mgau;
  int32 pass2var;
  vector_t ***wt_var;
  float32 ***wt_dcount;
  vector_t ***wt_mean;
  vector_t ***mean;
  float32 varfloor;
  uint32 mllr_add;
  uint32 mllr_mult;
  uint32 cdonly;
  char *moddeffn;
  char *cb2mllrfn;
  char *var_fn;
  char *mean_fn;
  char **accum_dir;
  char *out_mllr_fn;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  wt_mean = (vector_t ***)0x0;
  wt_dcount = (float32 ***)0x0;
  wt_var = (vector_t ***)0x0;
  _n_mgau = (vector_t ***)0x0;
  veclen_rd = (uint32 *)0x0;
  A = (float32 ****)0x0;
  B = (float32 ***)0x0;
  cb2mllr = (int32 *)0x0;
  mdef = (model_def_t *)0x0;
  out_mllr_fn = (char *)argv;
  argv_local._0_4_ = argc;
  iVar1 = initialize(argc,argv);
  if (iVar1 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x15a,"errors initializing.\n");
    exit(1);
  }
  pcVar3 = cmd_ln_get();
  accum_dir = (char **)cmd_ln_str_r(pcVar3,"-outmllrfn");
  pcVar3 = cmd_ln_get();
  mean_fn = (char *)cmd_ln_str_list_r(pcVar3,"-accumdir");
  pcVar3 = cmd_ln_get();
  var_fn = cmd_ln_str_r(pcVar3,"-meanfn");
  pcVar3 = cmd_ln_get();
  cb2mllrfn = cmd_ln_str_r(pcVar3,"-varfn");
  pcVar3 = cmd_ln_get();
  moddeffn = cmd_ln_str_r(pcVar3,"-cb2mllrfn");
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-cdonly");
  mllr_add = (uint32)lVar4;
  pcVar3 = cmd_ln_get();
  _mllr_mult = cmd_ln_str_r(pcVar3,"-moddeffn");
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-mllrmult");
  varfloor = (float32)lVar4;
  pcVar3 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar3,"-mllradd");
  mean._4_4_ = (uint32)lVar4;
  pcVar3 = cmd_ln_get();
  dVar5 = cmd_ln_float_r(pcVar3,"-varfloor");
  mean._0_4_ = (float)dVar5;
  if (*(long *)mean_fn == 0) {
    __assert_fail("accum_dir[0] != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                  ,0x16b,"int main(int, char **)");
  }
  if (((accum_dir == (char **)0x0) || (mean_fn == (char *)0x0)) || (var_fn == (char *)0x0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x16e,"Some of options are missing.\n");
    exit(1);
  }
  if (mean._0_4_ < 0.0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x171,"varfloor is negative (%e)\n",(double)mean._0_4_);
    exit(1);
  }
  if ((moddeffn != (char *)0x0) && (iVar1 = strcmp(moddeffn,"NO"), iVar1 == 0)) {
    moddeffn = (char *)0x0;
  }
  if ((_mllr_mult != (char *)0x0) && (iVar1 = strcmp(_mllr_mult,"NO"), iVar1 == 0)) {
    _mllr_mult = (char *)0x0;
  }
  fprintf(_stderr,"\n");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x17e,"-- 1. Read input mean, (var) and accumulation.\n");
  iVar1 = s3gau_read(var_fn,&wt_mean,&n_density,&n_mllr_class,&n_mgau_rd,&veclen_rd);
  if (iVar1 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x188,"Couldn\'t read %s",var_fn);
    exit(1);
  }
  local_f8 = 0;
  while (*(long *)(mean_fn + (ulong)local_f8 * 8) != 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x18d,"Reading and accumulating counts from %s\n",
            *(undefined8 *)(mean_fn + (ulong)local_f8 * 8));
    in_stack_fffffffffffffea8 = (uint32 *)((long)&veclen + 4);
    iVar1 = rdacc_den(*(char **)(mean_fn + (ulong)local_f8 * 8),(vector_t ****)&wt_dcount,
                      (vector_t ****)&n_mgau,(int32 *)&n_stream,(float32 ****)&wt_var,&n_density_rd,
                      in_stack_fffffffffffffea8,(uint32 *)&veclen,(uint32 **)&A);
    if (iVar1 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
              ,0x197,"Error in reading %s\n",*(undefined8 *)(mean_fn + (ulong)local_f8 * 8));
      exit(1);
    }
    local_f8 = local_f8 + 1;
  }
  if (n_density != n_density_rd) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x19c,"n_mgau mismatch (%u : %u)\n",(ulong)n_density,(ulong)n_density_rd);
    exit(1);
  }
  if (n_mllr_class != veclen._4_4_) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x19f,"n_stream mismatch (%u : %u)\n",(ulong)n_mllr_class,(ulong)veclen._4_4_);
    exit(1);
  }
  if (n_mgau_rd == (uint)veclen) {
    for (local_fc = 0; local_fc < n_mllr_class; local_fc = local_fc + 1) {
      if (veclen_rd[local_fc] != *(uint32 *)((long)A + (ulong)local_fc * 4)) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0x1a8,"vector length of stream %u (== %u) != prior length (== %u)\n",
                (ulong)local_fc,(ulong)*(uint *)((long)A + (ulong)local_fc * 4),
                CONCAT44((int)((ulong)in_stack_fffffffffffffea8 >> 0x20),veclen_rd[local_fc]));
        exit(1);
      }
    }
    ckd_free(A);
    A = (float32 ****)0x0;
    if (_n_mgau != (vector_t ***)0x0) {
      gauden_free_param(_n_mgau);
      _n_mgau = (vector_t ***)0x0;
    }
    fprintf(_stderr,"\n");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x1b4,"-- 2. Read cb2mllrfn\n");
    iVar1 = strcmp(moddeffn,".1cls.");
    if (iVar1 == 0) {
      n_stream_rd = 1;
      mdef = (model_def_t *)
             __ckd_calloc__((ulong)n_density,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                            ,0x1b9);
    }
    else {
      iVar1 = s3cb2mllr_read(moddeffn,(int32 **)&mdef,&n_density_rd,&n_stream_rd);
      if (iVar1 != 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0x1c0,"Unable to read %s\n",moddeffn);
        exit(1);
      }
      if (n_density_rd != n_density) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0x1c4,"cb2mllr maps %u cb, but read %u cb from files\n",(ulong)n_density_rd,
                (ulong)n_density);
        exit(1);
      }
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x1c7,"n_mllr_class = %d\n",(ulong)n_stream_rd);
    s = 0;
    if (mllr_add != 0) {
      if (_mllr_mult == (char *)0x0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0x1cd,"-moddeffn is not given.\n");
        exit(1);
      }
      iVar2 = model_def_read((model_def_t **)&i,_mllr_mult);
      if (iVar2 != 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0x1d0,"Can not read model definition file %s\n",_mllr_mult);
        exit(1);
      }
      s = _i->n_tied_ci_state;
      for (local_f8 = 0; local_f8 < s; local_f8 = local_f8 + 1) {
        *(undefined4 *)((long)&mdef->acmod_set + (ulong)local_f8 * 4) = 0xffffffff;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
              ,0x1d6,"Use CD senones only. (index >= %d)\n",(ulong)_i->n_tied_ci_state);
    }
    fprintf(_stderr,"\n");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x1db,"-- 3. Calculate mllr matrices\n");
    mllr_mat((float32 *****)&B,(float32 ****)&cb2mllr,cb2mllrfn,wt_mean,(vector_t ***)wt_dcount,
             (float32 ***)wt_var,s,(int32 *)mdef,(uint32)varfloor,mean._4_4_,(float32)mean._0_4_,
             n_density,n_mllr_class,n_mgau_rd,n_stream_rd,veclen_rd);
    fprintf(_stderr,"\n");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x1f1,"-- 4. Store mllr matrices (A,B) to %s\n",accum_dir);
    fflush(_stderr);
    iVar2 = store_reg_mat((char *)accum_dir,veclen_rd,n_stream_rd,n_mllr_class,(float32 ****)B,
                          (float32 ***)cb2mllr);
    if (iVar2 == 0) {
      ckd_free(veclen_rd);
      free_mllr_A((float32 ****)B,n_stream_rd,n_mllr_class);
      free_mllr_B((float32 ***)cb2mllr,n_stream_rd,n_mllr_class);
      return 0;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x1fb,"Unable to write %s\n",accum_dir);
    exit(1);
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x1a2,"n_density mismatch (%u : %u)\n",(ulong)n_mgau_rd,(ulong)(uint)veclen);
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
    const char  *out_mllr_fn;
    const char  **accum_dir;
    const char  *mean_fn;
    const char  *var_fn;
    const char  *cb2mllrfn;
    const char  *moddeffn;

    uint32      cdonly;
    uint32      mllr_mult;		/* option 0 or 1 */
    uint32      mllr_add;		/* option 0 or 1 */

    float32     varfloor;
    vector_t    ***mean         = NULL;         /* baseline mean */
    vector_t    ***wt_mean      = NULL;		/* read from bw accum */
    float32     ***wt_dcount    = NULL;		/* read from bw accum */
    vector_t    ***wt_var       = NULL;         /* not used */
    int32       pass2var;                       /* not used */

    uint32      n_mgau;
    uint32      n_stream;
    uint32      n_density;
    uint32      n_mllr_class;
    uint32      n_mgau_rd;
    uint32      n_stream_rd;
    uint32      n_density_rd;
    uint32 *veclen	= NULL;
    uint32 *veclen_rd	= NULL;

    float32     ****A  		= NULL;          /* Output mllr: A */
    float32     ***B   		= NULL;          /* Output mllr: B */

    int32       *cb2mllr   	= NULL;


    /*    int32       **mllr2cb  	= NULL;
	  int32       *n_mllr2cb 	= NULL;*/

    model_def_t *mdef;
    uint32	gau_begin;
    uint32 i,s ;

    if (initialize(argc, argv) != S3_SUCCESS) {
	E_FATAL("errors initializing.\n");
    }

    out_mllr_fn         = cmd_ln_str("-outmllrfn");
    accum_dir           = cmd_ln_str_list("-accumdir");
    mean_fn             = cmd_ln_str("-meanfn");
    var_fn              = cmd_ln_str("-varfn");

    cb2mllrfn           = cmd_ln_str("-cb2mllrfn");
    cdonly              = cmd_ln_int32("-cdonly");
    moddeffn            = cmd_ln_str("-moddeffn");

    mllr_mult      = cmd_ln_int32("-mllrmult");
    mllr_add            = cmd_ln_int32("-mllradd");
    varfloor            = cmd_ln_float32("-varfloor");


    assert(accum_dir[0] != NULL);	/* must be at least one accum dir */

    if (! (out_mllr_fn && accum_dir && mean_fn)) {
        E_FATAL("Some of options are missing.\n");
    }
    if (varfloor < 0.) {
        E_FATAL("varfloor is negative (%e)\n",varfloor);
    }


    if (cb2mllrfn && strcmp(cb2mllrfn,"NO") == 0) {
        cb2mllrfn = NULL;
    }
    if (moddeffn && strcmp(moddeffn,"NO") == 0) {
        moddeffn = NULL;
    }

    /*--------------------------------------------------------------------*/
    fprintf(stderr,"\n");
    E_INFO("-- 1. Read input mean, (var) and accumulation.\n");
    /*--------------------------------------------------------------------*/

    /*-------------- Read baseline mean --------------*/
    if (s3gau_read(mean_fn,
                   &mean,
                   &n_mgau,
                   &n_stream,
                   &n_density,
                   &veclen) != S3_SUCCESS) {
        E_FATAL("Couldn't read %s", mean_fn);
    }

    /*-------- Read accum_dir (accumulation from bw) --------*/
    for (i = 0; accum_dir[i]; i++) {
        E_INFO("Reading and accumulating counts from %s\n", accum_dir[i]);
        if (rdacc_den(accum_dir[i],
                      &wt_mean,
                      &wt_var,          
                      &pass2var,        
                      &wt_dcount,
                      &n_mgau_rd,
                      &n_stream_rd,
                      &n_density_rd,
                      &veclen_rd) != S3_SUCCESS) {
            E_FATAL("Error in reading %s\n", accum_dir[i]);
        }
    }

    if (n_mgau != n_mgau_rd) {
        E_FATAL("n_mgau mismatch (%u : %u)\n",n_mgau,n_mgau_rd);
    }
    if (n_stream != n_stream_rd) {
        E_FATAL("n_stream mismatch (%u : %u)\n",n_stream,n_stream_rd);
    }
    if (n_density != n_density_rd) {
        E_FATAL("n_density mismatch (%u : %u)\n",n_density,n_density_rd);
    }
    for (s = 0; s < n_stream; s++) {
        if (veclen[s] != veclen_rd[s]) {
            E_FATAL("vector length of stream %u (== %u) "
                    "!= prior length (== %u)\n",
                    s, veclen_rd[s], veclen[s]);
        }
    }
    ckd_free((void *)veclen_rd);
    veclen_rd = NULL;
    if (wt_var) {               /* We don't use 'wt_var' in this program. */
        gauden_free_param(wt_var);
        wt_var = NULL;
    }

    /*--------------------------------------------------------------------*/
    fprintf(stderr,"\n");
    E_INFO("-- 2. Read cb2mllrfn\n");
    /*--------------------------------------------------------------------*/

    if (strcmp(cb2mllrfn, ".1cls.") == 0) {
        n_mllr_class = 1;
        cb2mllr = (int32 *) ckd_calloc(n_mgau, sizeof(int32));
    }
    else {
        if (s3cb2mllr_read(cb2mllrfn,
                           &cb2mllr,
                           &n_mgau_rd,
                           &n_mllr_class) != S3_SUCCESS) {
            E_FATAL("Unable to read %s\n",cb2mllrfn);
        }
        if (n_mgau_rd != n_mgau) {
            E_FATAL("cb2mllr maps %u cb, but read %u cb from files\n",
                    n_mgau_rd, n_mgau);
        }
    }
    E_INFO("n_mllr_class = %d\n", n_mllr_class);

    gau_begin = 0;
    if (cdonly) {

        if (! moddeffn) {
            E_FATAL("-moddeffn is not given.\n");
        }
        else if (model_def_read(&mdef, moddeffn) != S3_SUCCESS) {
            E_FATAL("Can not read model definition file %s\n", moddeffn);
        }
        gau_begin = mdef->n_tied_ci_state;
        for (i=0; i<gau_begin; i++) {
            cb2mllr[i] = -1;                    /* skip CI senones */
        }
        E_INFO("Use CD senones only. (index >= %d)\n",mdef->n_tied_ci_state);
    }

    /*--------------------------------------------------------------------*/
    fprintf(stderr,"\n");
    E_INFO("-- 3. Calculate mllr matrices\n");
    /*--------------------------------------------------------------------*/

    mllr_mat(&A,
	     &B,
	     var_fn,
	     mean,
	     wt_mean,
	     wt_dcount,
	     gau_begin,
	     cb2mllr,
	     mllr_mult,
	     mllr_add,
	     varfloor,
	     n_mgau,
	     n_stream,
	     n_density,
	     n_mllr_class,
	     veclen);

    /*--------------------------------------------------------------------*/
    fprintf(stderr,"\n");
    E_INFO("-- 4. Store mllr matrices (A,B) to %s\n", out_mllr_fn);
fflush(stderr);
    /*--------------------------------------------------------------------*/

    if(store_reg_mat(out_mllr_fn,
                     veclen,
                     n_mllr_class,
                     n_stream,
                     A,
                     B) != S3_SUCCESS) {
        E_FATAL("Unable to write %s\n", out_mllr_fn);
    }

    ckd_free((void *)veclen);
    free_mllr_A(A, n_mllr_class, n_stream);
    free_mllr_B(B, n_mllr_class, n_stream);
    return 0 ;
}